

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosNetwork.cpp
# Opt level: O2

void __thiscall
adios2::helper::NetworkSocket::RequestResponse
          (NetworkSocket *this,string *request,char *response,size_t maxResponseSize)

{
  ssize_t sVar1;
  allocator local_9c;
  allocator local_9b;
  allocator local_9a;
  allocator local_99;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  sVar1 = write(this->m_Data->m_Socket,(request->_M_dataplus)._M_p,request->_M_string_length);
  if (sVar1 == -1) {
    std::__cxx11::string::string((string *)&local_38,"Helper",&local_99);
    std::__cxx11::string::string((string *)&local_58,"helper:adiosNetwork",&local_9a);
    std::__cxx11::string::string((string *)&local_78,"RequestResponse",&local_9b);
    std::__cxx11::string::string((string *)&local_98,"error: Cannot send request",&local_9c);
    Throw<std::ios_base::failure[abi:cxx11]>(&local_38,&local_58,&local_78,&local_98,-1);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_38);
  }
  sVar1 = read(this->m_Data->m_Socket,response,maxResponseSize - 1);
  if (sVar1 == -1) {
    std::__cxx11::string::string((string *)&local_38,"Helper",&local_99);
    std::__cxx11::string::string((string *)&local_58,"helper:adiosNetwork",&local_9a);
    std::__cxx11::string::string((string *)&local_78,"RequestResponse",&local_9b);
    std::__cxx11::string::string((string *)&local_98,"error: Cannot get response",&local_9c);
    Throw<std::ios_base::failure[abi:cxx11]>(&local_38,&local_58,&local_78,&local_98,-1);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_38);
  }
  response[sVar1] = '\0';
  return;
}

Assistant:

void NetworkSocket::RequestResponse(const std::string &request, char *response,
                                    size_t maxResponseSize)
{
#ifdef _WIN32
    int result;
    int len = static_cast<int>(request.length());
    int maxlen = static_cast<int>(maxResponseSize) - 1;
#else
    ssize_t result;
    size_t len = request.length();
    size_t maxlen = maxResponseSize - 1;
#endif
    result = write(m_Data->m_Socket, request.c_str(), len);
    if (result == -1)
    {
        helper::Throw<std::ios_base::failure>("Helper", "helper:adiosNetwork", "RequestResponse",
                                              "error: Cannot send request");
    }

    result = read(m_Data->m_Socket, response, maxlen);
    if (result == -1)
    {
        helper::Throw<std::ios_base::failure>("Helper", "helper:adiosNetwork", "RequestResponse",
                                              "error: Cannot get response");
    }
    // safely null terminate
    response[result] = '\0';
}